

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O0

int32_t conv_mcnp6_pdg2ssw(int32_t c)

{
  int iVar1;
  int iVar2;
  int local_24;
  int32_t res;
  int32_t Z;
  int32_t A;
  int32_t I;
  int i;
  int32_t absc;
  int32_t c_local;
  int local_4;
  
  local_24 = c;
  if (c < 0) {
    local_24 = -c;
  }
  if (local_24 < 0x3b9b1849) {
    if (c == -0xb) {
      return 7;
    }
    for (i = 0; i < 0x25; i = i + 1) {
      if (conv_mcnp6_to_pdg_0to36[i] == c) {
        return i << 1;
      }
    }
    for (i = 0; i < 0x25; i = i + 1) {
      if (conv_mcnp6_to_pdg_0to36[i] == -c) {
        return i * 2 + 1;
      }
    }
  }
  if ((local_24 < 0x3b9aca01) || (0x3c336076 < local_24)) {
    local_4 = 0;
  }
  else {
    iVar1 = (local_24 / 10) % 1000;
    iVar2 = ((local_24 / 10) / 1000) % 1000;
    if (((iVar1 == 0) || (iVar2 == 0)) || (iVar1 < iVar2)) {
      local_4 = 0;
    }
    else {
      local_4 = (local_24 % 10) * 0x800000 + iVar2 * 0x10000 + iVar1 * 0x80 + (c < 0) + 0x4a;
    }
  }
  return local_4;
}

Assistant:

int32_t conv_mcnp6_pdg2ssw( int32_t c )
{
  int32_t absc = c < 0 ? -c : c;
  if (absc <= 1000020040) {
    if (c==-11)
      return 7;//e+ is special case, pick 7 (anti e-) rather than 16 (straight e+)
    int i;
    for (i = 0; i<37; ++i) {
      if (conv_mcnp6_to_pdg_0to36[i]==c)
        return 2*i;
    }
    for (i = 0; i<37; ++i) {
      if (conv_mcnp6_to_pdg_0to36[i] == -c)
        return 1 + 2*i;
    }
  }
  if (absc>1000000000&&absc<=1009999990) {
    //Ions. PDG format for ions is 10LZZZAAAI, where L!=0 indicates strangeness
    //and I!=0 indicates exited nuclei. We only allow L=0 ions here.
    int32_t I = absc % 10;//isomer level
    absc/=10;
    int32_t A = absc%1000;
    absc/=1000;
    int32_t Z = absc % 1000;
    assert(absc/1000==100);//L=0 guaranteed by enclosing condition.
    if ( !A || !Z || Z>A )
      return 0;
    int32_t res = (c<0?1:0);
    res += 2*37;
    res += 128*A;
    res += 128*512*Z;
    res += 128*512*128*I;
    return res;
  }
  return 0;
}